

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionFactory.cpp
# Opt level: O0

void __thiscall
FIX::SessionFactory::processFixtDataDictionaries
          (SessionFactory *this,SessionID *sessionID,Dictionary *settings,
          DataDictionaryProvider *provider)

{
  undefined8 __lhs;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  bool bVar2;
  __type_conflict1 _Var3;
  BeginString *beginString;
  ConfigError *this_00;
  undefined1 local_3f8 [104];
  ApplVerID local_390;
  undefined1 local_338 [8];
  string beginStringQualifier;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  long local_290;
  size_type offset;
  string local_280 [32];
  undefined1 local_260 [24];
  string local_248;
  string local_228;
  BeginString local_208;
  ApplVerID local_1b0;
  allocator<char> local_151;
  string local_150;
  string local_130;
  allocator<char> local_109;
  string local_108;
  string local_e8;
  undefined1 local_c8 [8];
  string frontKey;
  string *key;
  value_type *data;
  iterator __end1;
  iterator __begin1;
  Dictionary *__range1;
  allocator<char> local_59;
  string local_58 [32];
  undefined1 local_38 [8];
  shared_ptr<FIX::DataDictionary> pDataDictionary;
  DataDictionaryProvider *provider_local;
  Dictionary *settings_local;
  SessionID *sessionID_local;
  SessionFactory *this_local;
  
  pDataDictionary.super___shared_ptr<FIX::DataDictionary,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)provider;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_58,"TransportDataDictionary",&local_59);
  createDataDictionary
            ((SessionFactory *)local_38,(SessionID *)this,(Dictionary *)sessionID,(string *)settings
            );
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator(&local_59);
  _Var1 = pDataDictionary.super___shared_ptr<FIX::DataDictionary,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount;
  beginString = SessionID::getBeginString(sessionID);
  std::shared_ptr<FIX::DataDictionary>::shared_ptr
            ((shared_ptr<FIX::DataDictionary> *)&__range1,
             (shared_ptr<FIX::DataDictionary> *)local_38);
  DataDictionaryProvider::addTransportDataDictionary
            ((DataDictionaryProvider *)_Var1._M_pi,beginString,
             (shared_ptr<FIX::DataDictionary> *)&__range1);
  std::shared_ptr<FIX::DataDictionary>::~shared_ptr((shared_ptr<FIX::DataDictionary> *)&__range1);
  __end1 = Dictionary::begin_abi_cxx11_(settings);
  data = (value_type *)Dictionary::end_abi_cxx11_(settings);
  do {
    bVar2 = std::operator!=(&__end1,(_Self *)&data);
    if (!bVar2) {
      std::shared_ptr<FIX::DataDictionary>::~shared_ptr((shared_ptr<FIX::DataDictionary> *)local_38)
      ;
      return;
    }
    frontKey.field_2._8_8_ =
         std::
         _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::operator*(&__end1);
    std::__cxx11::string::substr((ulong)local_c8,frontKey.field_2._8_8_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_108,"AppDataDictionary",&local_109);
    string_toUpper(&local_e8,&local_108);
    _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_c8,&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_108);
    std::allocator<char>::~allocator(&local_109);
    __lhs = frontKey.field_2._8_8_;
    if (_Var3) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_150,"AppDataDictionary",&local_151);
      string_toUpper(&local_130,&local_150);
      _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __lhs,&local_130);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_150);
      std::allocator<char>::~allocator(&local_151);
      _Var1 = pDataDictionary.super___shared_ptr<FIX::DataDictionary,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount;
      if (_Var3) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_248,"DefaultApplVerID",(allocator<char> *)(local_260 + 0x17));
        Dictionary::getString(&local_228,settings,&local_248,false);
        BeginString::BeginString(&local_208,&local_228);
        Message::toApplVerID(&local_1b0,&local_208);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (local_280,"AppDataDictionary",(allocator<char> *)((long)&offset + 7));
        createDataDictionary
                  ((SessionFactory *)local_260,(SessionID *)this,(Dictionary *)sessionID,
                   (string *)settings);
        DataDictionaryProvider::addApplicationDataDictionary
                  ((DataDictionaryProvider *)_Var1._M_pi,&local_1b0,
                   (shared_ptr<FIX::DataDictionary> *)local_260);
        std::shared_ptr<FIX::DataDictionary>::~shared_ptr
                  ((shared_ptr<FIX::DataDictionary> *)local_260);
        std::__cxx11::string::~string(local_280);
        std::allocator<char>::~allocator((allocator<char> *)((long)&offset + 7));
        ApplVerID::~ApplVerID(&local_1b0);
        BeginString::~BeginString(&local_208);
        std::__cxx11::string::~string((string *)&local_228);
        std::__cxx11::string::~string((string *)&local_248);
        std::allocator<char>::~allocator((allocator<char> *)(local_260 + 0x17));
      }
      else {
        local_290 = std::__cxx11::string::find((char)frontKey.field_2._8_8_,0x2e);
        if (local_290 == -1) {
          beginStringQualifier.field_2._M_local_buf[0xe] = '\x01';
          this_00 = (ConfigError *)__cxa_allocate_exception(0x50);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_310,"Malformed ",
                     (allocator<char> *)(beginStringQualifier.field_2._M_local_buf + 0xf));
          std::operator+(&local_2f0,&local_310,"AppDataDictionary");
          std::operator+(&local_2d0,&local_2f0,": ");
          std::operator+(&local_2b0,&local_2d0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         frontKey.field_2._8_8_);
          ConfigError::ConfigError(this_00,&local_2b0);
          beginStringQualifier.field_2._M_local_buf[0xe] = '\0';
          __cxa_throw(this_00,&ConfigError::typeinfo,ConfigError::~ConfigError);
        }
        std::__cxx11::string::substr((ulong)local_338,frontKey.field_2._8_8_);
        _Var1 = pDataDictionary.super___shared_ptr<FIX::DataDictionary,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount;
        BeginString::BeginString((BeginString *)(local_3f8 + 0x10),(STRING *)local_338);
        Message::toApplVerID(&local_390,(BeginString *)(local_3f8 + 0x10));
        createDataDictionary
                  ((SessionFactory *)local_3f8,(SessionID *)this,(Dictionary *)sessionID,
                   (string *)settings);
        DataDictionaryProvider::addApplicationDataDictionary
                  ((DataDictionaryProvider *)_Var1._M_pi,&local_390,
                   (shared_ptr<FIX::DataDictionary> *)local_3f8);
        std::shared_ptr<FIX::DataDictionary>::~shared_ptr
                  ((shared_ptr<FIX::DataDictionary> *)local_3f8);
        ApplVerID::~ApplVerID(&local_390);
        BeginString::~BeginString((BeginString *)(local_3f8 + 0x10));
        std::__cxx11::string::~string((string *)local_338);
      }
    }
    std::__cxx11::string::~string((string *)local_c8);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

EXCEPT(ConfigError) {
  std::shared_ptr<DataDictionary> pDataDictionary
      = createDataDictionary(sessionID, settings, TRANSPORT_DATA_DICTIONARY);
  provider.addTransportDataDictionary(sessionID.getBeginString(), pDataDictionary);

  for (const Dictionary::value_type &data : settings) {
    const std::string &key = data.first;
    const std::string frontKey = key.substr(0, strlen(APP_DATA_DICTIONARY));
    if (frontKey == string_toUpper(APP_DATA_DICTIONARY)) {
      if (key == string_toUpper(APP_DATA_DICTIONARY)) {
        provider.addApplicationDataDictionary(
            Message::toApplVerID(settings.getString(DEFAULT_APPLVERID)),
            createDataDictionary(sessionID, settings, APP_DATA_DICTIONARY));
      } else {
        std::string::size_type offset = key.find('.');
        if (offset == std::string::npos) {
          throw ConfigError(std::string("Malformed ") + APP_DATA_DICTIONARY + ": " + key);
        }
        std::string beginStringQualifier = key.substr(offset + 1);
        provider.addApplicationDataDictionary(
            Message::toApplVerID(beginStringQualifier),
            createDataDictionary(sessionID, settings, key));
      }
    }
  }
}